

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Probe.cpp
# Opt level: O2

void __thiscall helics::apps::Probe::Probe(Probe *this,int argc,char **argv)

{
  string_view defaultAppName;
  
  defaultAppName._M_str = "probe_${#}";
  defaultAppName._M_len = 10;
  App::App(&this->super_App,defaultAppName,argc,argv);
  (this->super_App)._vptr_App = (_func_int **)&PTR__Probe_004bdb40;
  Endpoint::Endpoint(&this->endpoint);
  this->connections = 0;
  this->messagesReceived = 0;
  return;
}

Assistant:

Probe::Probe(int argc, char* argv[]): App("probe_${#}", argc, argv) {}